

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

void ot::commissioner::CommissionerApp::MergeDataset(BbrDataset *aDst,BbrDataset *aSrc)

{
  byte *pbVar1;
  
  if ((short)aSrc->mPresentFlags < 0) {
    std::__cxx11::string::_M_assign((string *)aDst);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if ((aSrc->mPresentFlags & 0x4000) != 0) {
    std::__cxx11::string::_M_assign((string *)&aDst->mRegistrarHostname);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if ((aSrc->mPresentFlags & 0x2000) != 0) {
    std::__cxx11::string::_M_assign((string *)&aDst->mRegistrarIpv6Addr);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return;
}

Assistant:

void CommissionerApp::MergeDataset(BbrDataset &aDst, const BbrDataset &aSrc)
{
#define SET_IF_PRESENT(name)                            \
    if (aSrc.mPresentFlags & BbrDataset::k##name##Bit)  \
    {                                                   \
        aDst.m##name = aSrc.m##name;                    \
        aDst.mPresentFlags |= BbrDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(TriHostname);
    SET_IF_PRESENT(RegistrarHostname);
    SET_IF_PRESENT(RegistrarIpv6Addr);

#undef SET_IF_PRESENT
}